

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepCompositing.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepCompositing::composite_pixel
          (DeepCompositing *this,float *outputs,float **inputs,char **channel_names,int num_channels
          ,int num_samples,int sources)

{
  float fVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<int,_std::allocator<int>_> sort_order;
  undefined1 local_58 [16];
  pointer local_48;
  char **local_40;
  DeepCompositing *local_38;
  
  local_38 = this;
  if (0 < num_channels) {
    memset(outputs,0,(ulong)(uint)num_channels * 4);
  }
  if (num_samples != 0) {
    local_58 = (undefined1  [16])0x0;
    local_48 = (pointer)0x0;
    local_40 = channel_names;
    if (1 < sources) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_58,(long)num_samples);
      auVar2 = _DAT_001c42e0;
      if (0 < num_samples) {
        lVar3 = (ulong)(uint)num_samples - 1;
        auVar7._8_4_ = (int)lVar3;
        auVar7._0_8_ = lVar3;
        auVar7._12_4_ = (int)((ulong)lVar3 >> 0x20);
        uVar4 = 0;
        auVar7 = auVar7 ^ _DAT_001c42e0;
        auVar8 = _DAT_001c42c0;
        do {
          auVar9 = auVar8 ^ auVar2;
          if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                      auVar7._4_4_ < auVar9._4_4_) & 1)) {
            *(int *)(local_58._0_8_ + uVar4 * 4) = (int)uVar4;
          }
          if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
              auVar9._12_4_ <= auVar7._12_4_) {
            *(int *)(local_58._0_8_ + (uVar4 + 1) * 4) = (int)uVar4 + 1;
          }
          uVar4 = uVar4 + 2;
          lVar3 = auVar8._8_8_;
          auVar8._0_8_ = auVar8._0_8_ + 2;
          auVar8._8_8_ = lVar3 + 2;
        } while ((num_samples + 1U & 0xfffffffe) != uVar4);
      }
      (*local_38->_vptr_DeepCompositing[3])
                (local_38,local_58._0_8_,inputs,local_40,num_channels,(ulong)(uint)num_samples,
                 sources);
    }
    if (0 < num_samples) {
      uVar4 = 0;
      while( true ) {
        iVar5 = (int)uVar4;
        if (1 < sources) {
          iVar5 = *(int *)(local_58._0_8_ + uVar4 * 4);
        }
        fVar1 = outputs[2];
        if (1.0 <= fVar1) break;
        if (0 < num_channels) {
          uVar6 = 0;
          do {
            outputs[uVar6] = inputs[uVar6][iVar5] * (1.0 - fVar1) + outputs[uVar6];
            uVar6 = uVar6 + 1;
          } while ((uint)num_channels != uVar6);
        }
        if ((1.0 <= fVar1) || (uVar4 = uVar4 + 1, uVar4 == (uint)num_samples)) break;
      }
    }
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
    }
  }
  return;
}

Assistant:

void
DeepCompositing::composite_pixel (
    float        outputs[],
    const float* inputs[],
    const char*  channel_names[],
    int          num_channels,
    int          num_samples,
    int          sources)
{
    for (int i = 0; i < num_channels; i++)
        outputs[i] = 0.0;
    // no samples? do nothing
    if (num_samples == 0) { return; }

    vector<int> sort_order;
    if (sources > 1)
    {
        sort_order.resize (num_samples);
        for (int i = 0; i < num_samples; i++)
            sort_order[i] = i;
        sort (
            &sort_order[0],
            inputs,
            channel_names,
            num_channels,
            num_samples,
            sources);
    }

    for (int i = 0; i < num_samples; i++)
    {
        int   s     = (sources > 1) ? sort_order[i] : i;
        float alpha = outputs[2];
        if (alpha >= 1.0f) return;

        for (int c = 0; c < num_channels; c++)
        {
            outputs[c] += (1.0f - alpha) * inputs[c][s];
        }
    }
}